

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_GLMRegressor_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00352d58 == '\x01') {
    DAT_00352d58 = '\0';
    (*(code *)*_GLMRegressor_DoubleArray_default_instance_)();
  }
  if (DAT_00352da8 == '\x01') {
    DAT_00352da8 = 0;
    (*(code *)*_GLMRegressor_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMRegressor_DoubleArray_default_instance_.Shutdown();
  _GLMRegressor_default_instance_.Shutdown();
}